

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-strtok.c
# Opt level: O1

int run_test_strtok(void)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  int extraout_EAX;
  uv_loop_t *puVar5;
  uv_loop_t *puVar6;
  long lVar7;
  uv_loop_t *unaff_RBX;
  char *pcVar8;
  void *pvVar9;
  char *pcVar10;
  uv_handle_t **ppuVar11;
  uv_stream_t *server;
  int64_t eval_b;
  int64_t eval_a;
  char current_test [2048];
  undefined1 auStack_918 [16];
  uv_buf_t uStack_908;
  uv_loop_t *puStack_8f8;
  uv_handle_t *puStack_8e8;
  uv_handle_t *puStack_8e0;
  sockaddr_in sStack_8d8;
  uv_connect_t uStack_8c8;
  uv_loop_t *puStack_860;
  undefined8 local_850;
  void *local_848;
  long local_840;
  char local_838 [2056];
  
  pvVar9 = (void *)0x0;
  lVar7 = 0;
  while( true ) {
    local_850._0_4_ = 0x12;
    local_850._4_4_ = 0;
    puVar6 = unaff_RBX;
    local_848 = pvVar9;
    if (0x11 < (long)pvVar9) break;
    pcVar1 = (char *)(&DAT_00268cd8)[lVar7 * 2];
    puStack_860 = (uv_loop_t *)0x1c1cbd;
    local_840 = lVar7;
    snprintf(local_838,0x800,"%s",(&PTR_anon_var_dwarf_b1917_00268cd0)[lVar7 * 2]);
    if (local_838[0] != '\0') {
      pcVar10 = pcVar1;
      cVar2 = *pcVar1;
      pcVar8 = local_838;
      cVar3 = local_838[0];
      do {
        while (cVar2 != '\0') {
          pcVar10 = pcVar10 + 1;
          if (cVar3 == cVar2) {
            *pcVar8 = '\0';
            unaff_RBX = (uv_loop_t *)(pcVar8 + 1);
            goto LAB_001c1cfe;
          }
          cVar2 = *pcVar10;
        }
        cVar3 = pcVar8[1];
        pcVar8 = pcVar8 + 1;
        pcVar10 = pcVar1;
        cVar2 = *pcVar1;
      } while (cVar3 != '\0');
    }
    unaff_RBX = (uv_loop_t *)0x0;
LAB_001c1cfe:
    if (tokens[(long)pvVar9] == (char *)0x0) {
LAB_001c1d14:
      local_848 = (void *)0x0;
    }
    else {
      puStack_860 = (uv_loop_t *)0x1c1d10;
      iVar4 = strcmp(local_838,tokens[(long)pvVar9]);
      if (iVar4 != 0) goto LAB_001c1d14;
      local_848 = (void *)0x1;
    }
    local_850._0_4_ = 0;
    local_850._4_4_ = 0;
    puVar6 = unaff_RBX;
    if (local_848 == (void *)0x0) {
LAB_001c1e4d:
      puStack_860 = (uv_loop_t *)0x1c1e5c;
      run_test_strtok_cold_4();
      break;
    }
    pvVar9 = (void *)((long)pvVar9 + 1);
    do {
      local_850._0_4_ = 0x12;
      local_850._4_4_ = 0;
      puVar6 = unaff_RBX;
      local_848 = pvVar9;
      if (0x11 < (long)pvVar9) {
        puStack_860 = (uv_loop_t *)0x1c1e3e;
        run_test_strtok_cold_2();
LAB_001c1e3e:
        puStack_860 = (uv_loop_t *)0x1c1e4d;
        run_test_strtok_cold_3();
        goto LAB_001c1e4d;
      }
      if (unaff_RBX == (uv_loop_t *)0x0) {
        puVar6 = (uv_loop_t *)0x0;
      }
      else {
        cVar3 = *(char *)&unaff_RBX->data;
        if (cVar3 != '\0') {
          pcVar10 = pcVar1;
          cVar2 = *pcVar1;
          puVar5 = unaff_RBX;
          do {
            while (cVar2 != '\0') {
              pcVar10 = pcVar10 + 1;
              if (cVar3 == cVar2) {
                *(undefined1 *)&puVar5->data = 0;
                unaff_RBX = (uv_loop_t *)((long)&puVar5->data + 1);
                goto LAB_001c1daa;
              }
              cVar2 = *pcVar10;
            }
            cVar3 = *(char *)((long)&puVar5->data + 1);
            puVar5 = (uv_loop_t *)((long)&puVar5->data + 1);
            pcVar10 = pcVar1;
            cVar2 = *pcVar1;
          } while (cVar3 != '\0');
        }
        unaff_RBX = (uv_loop_t *)0x0;
      }
LAB_001c1daa:
      if ((puVar6 == (uv_loop_t *)0x0) || (tokens[(long)pvVar9] == (char *)0x0)) {
LAB_001c1dc5:
        local_848 = (void *)(ulong)(tokens[(long)pvVar9] == (char *)0x0 &&
                                   puVar6 == (uv_loop_t *)0x0);
      }
      else {
        puStack_860 = (uv_loop_t *)0x1c1dc1;
        iVar4 = strcmp((char *)puVar6,tokens[(long)pvVar9]);
        if (iVar4 != 0) goto LAB_001c1dc5;
        local_848 = (void *)0x1;
      }
      local_850._0_4_ = 0;
      local_850._4_4_ = 0;
      if (local_848 == (void *)0x0) goto LAB_001c1e3e;
      pvVar9 = (void *)((long)pvVar9 + 1);
    } while (puVar6 != (uv_loop_t *)0x0);
    lVar7 = local_840 + 1;
    if (lVar7 == 4) {
      return 0;
    }
  }
  puStack_860 = (uv_loop_t *)0x1c1e6b;
  run_test_strtok_cold_1();
  puStack_8f8 = (uv_loop_t *)0x1c1e8a;
  puStack_860 = puVar6;
  iVar4 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)&uStack_8c8);
  sStack_8d8._0_8_ = SEXT48(iVar4);
  puStack_8e8 = (uv_handle_t *)0x0;
  if (sStack_8d8._0_8_ == 0) {
    puStack_8f8 = (uv_loop_t *)0x1c1eaf;
    puVar5 = uv_default_loop();
    puStack_8f8 = (uv_loop_t *)0x1c1ebe;
    iVar4 = uv_tcp_init(puVar5,&::server);
    sStack_8d8._0_8_ = SEXT48(iVar4);
    puStack_8e8 = (uv_handle_t *)0x0;
    if (sStack_8d8._0_8_ != 0) goto LAB_001c20fd;
    puStack_8f8 = (uv_loop_t *)0x1c1ef1;
    iVar4 = uv_tcp_bind(&::server,(sockaddr *)&uStack_8c8,0);
    sStack_8d8._0_8_ = SEXT48(iVar4);
    puStack_8e8 = (uv_handle_t *)0x0;
    if (sStack_8d8._0_8_ != 0) goto LAB_001c210c;
    puStack_8f8 = (uv_loop_t *)0x1c1f29;
    iVar4 = uv_listen((uv_stream_t *)&::server,0x80,connection_cb);
    sStack_8d8._0_8_ = SEXT48(iVar4);
    puStack_8e8 = (uv_handle_t *)0x0;
    if (sStack_8d8._0_8_ != 0) goto LAB_001c211b;
    puStack_8f8 = (uv_loop_t *)0x1c1f5f;
    iVar4 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_8d8);
    uStack_8c8.data = (void *)(long)iVar4;
    puStack_8e8 = (uv_handle_t *)0x0;
    if ((uv_read_cb)uStack_8c8.data != (uv_read_cb)0x0) goto LAB_001c212a;
    puStack_8f8 = (uv_loop_t *)0x1c1f84;
    puVar5 = uv_default_loop();
    puStack_8f8 = (uv_loop_t *)0x1c1f93;
    iVar4 = uv_tcp_init(puVar5,&client);
    uStack_8c8.data = (void *)(long)iVar4;
    puStack_8e8 = (uv_handle_t *)0x0;
    if ((uv_read_cb)uStack_8c8.data != (uv_read_cb)0x0) goto LAB_001c2139;
    puStack_8f8 = (uv_loop_t *)0x1c1fd0;
    iVar4 = uv_tcp_connect(&uStack_8c8,&client,(sockaddr *)&sStack_8d8,connect_cb);
    puStack_8e8 = (uv_handle_t *)(long)iVar4;
    puStack_8e0 = (uv_handle_t *)0x0;
    if (puStack_8e8 != (uv_handle_t *)0x0) goto LAB_001c2148;
    puStack_8f8 = (uv_loop_t *)0x1c1ff5;
    puVar5 = uv_default_loop();
    puStack_8f8 = (uv_loop_t *)0x1c1fff;
    iVar4 = uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_8e8 = (uv_handle_t *)(long)iVar4;
    puStack_8e0 = (uv_handle_t *)0x0;
    if (puStack_8e8 != (uv_handle_t *)0x0) goto LAB_001c2157;
    puStack_8e8 = (uv_handle_t *)0x1;
    puStack_8e0 = (uv_handle_t *)(long)connect_cb_called;
    if (puStack_8e0 != (uv_handle_t *)0x1) goto LAB_001c2166;
    puStack_8e8 = (uv_handle_t *)0x1;
    puStack_8e0 = (uv_handle_t *)(long)connection_cb_called;
    if (puStack_8e0 != (uv_handle_t *)0x1) goto LAB_001c2175;
    puStack_8e8 = (uv_handle_t *)0x3;
    puStack_8e0 = (uv_handle_t *)(long)close_cb_called;
    if (puStack_8e0 != (uv_handle_t *)0x3) goto LAB_001c2184;
    puStack_8f8 = (uv_loop_t *)0x1c2093;
    puVar6 = uv_default_loop();
    puStack_8f8 = (uv_loop_t *)0x1c20a7;
    uv_walk(puVar6,close_walk_cb,(void *)0x0);
    puStack_8f8 = (uv_loop_t *)0x1c20b1;
    uv_run(puVar6,UV_RUN_DEFAULT);
    puStack_8e8 = (uv_handle_t *)0x0;
    puStack_8f8 = (uv_loop_t *)0x1c20bf;
    puVar5 = uv_default_loop();
    puStack_8f8 = (uv_loop_t *)0x1c20c7;
    iVar4 = uv_loop_close(puVar5);
    puStack_8e0 = (uv_handle_t *)(long)iVar4;
    if (puStack_8e8 == puStack_8e0) {
      puStack_8f8 = (uv_loop_t *)0x1c20e3;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_8f8 = (uv_loop_t *)0x1c20fd;
    run_test_tcp_alloc_cb_fail_cold_1();
LAB_001c20fd:
    puStack_8f8 = (uv_loop_t *)0x1c210c;
    run_test_tcp_alloc_cb_fail_cold_2();
LAB_001c210c:
    puStack_8f8 = (uv_loop_t *)0x1c211b;
    run_test_tcp_alloc_cb_fail_cold_3();
LAB_001c211b:
    puStack_8f8 = (uv_loop_t *)0x1c212a;
    run_test_tcp_alloc_cb_fail_cold_4();
LAB_001c212a:
    puStack_8f8 = (uv_loop_t *)0x1c2139;
    run_test_tcp_alloc_cb_fail_cold_5();
LAB_001c2139:
    puStack_8f8 = (uv_loop_t *)0x1c2148;
    run_test_tcp_alloc_cb_fail_cold_6();
LAB_001c2148:
    puStack_8f8 = (uv_loop_t *)0x1c2157;
    run_test_tcp_alloc_cb_fail_cold_7();
LAB_001c2157:
    puStack_8f8 = (uv_loop_t *)0x1c2166;
    run_test_tcp_alloc_cb_fail_cold_8();
LAB_001c2166:
    puStack_8f8 = (uv_loop_t *)0x1c2175;
    run_test_tcp_alloc_cb_fail_cold_9();
LAB_001c2175:
    puStack_8f8 = (uv_loop_t *)0x1c2184;
    run_test_tcp_alloc_cb_fail_cold_10();
LAB_001c2184:
    puStack_8f8 = (uv_loop_t *)0x1c2193;
    run_test_tcp_alloc_cb_fail_cold_11();
  }
  ppuVar11 = &puStack_8e8;
  iVar4 = (int)&puStack_8e0;
  puStack_8f8 = (uv_loop_t *)connect_cb;
  run_test_tcp_alloc_cb_fail_cold_12();
  server = (uv_stream_t *)auStack_918;
  uStack_908.base = (char *)(long)iVar4;
  auStack_918._0_8_ = (void *)0x0;
  puStack_8f8 = puVar6;
  if ((char *)(long)iVar4 == (char *)0x0) {
    connect_cb_called = connect_cb_called + 1;
    uStack_908 = uv_buf_init(hello,7);
    iVar4 = uv_write(&write_req,(uv_stream_t *)ppuVar11[10],&uStack_908,1,write_cb);
    auStack_918._0_8_ = SEXT48(iVar4);
    auStack_918._8_8_ = (uv_loop_t *)0x0;
    if ((void *)auStack_918._0_8_ == (void *)0x0) {
      return iVar4;
    }
  }
  else {
    connect_cb_cold_1();
  }
  iVar4 = (int)auStack_918 + 8;
  connect_cb_cold_2();
  if (iVar4 == 0) {
    iVar4 = uv_tcp_init(server->loop,&incoming);
    if (iVar4 != 0) goto LAB_001c2308;
    iVar4 = uv_accept(server,(uv_stream_t *)&incoming);
    if (iVar4 == 0) {
      iVar4 = uv_read_start((uv_stream_t *)&incoming,conn_alloc_cb,conn_read_cb);
      if (iVar4 == 0) {
        connection_cb_called = connection_cb_called + 1;
        return 0;
      }
      goto LAB_001c2322;
    }
  }
  else {
    connection_cb_cold_1();
LAB_001c2308:
    connection_cb_cold_2();
  }
  connection_cb_cold_3();
LAB_001c2322:
  connection_cb_cold_4();
  return extraout_EAX;
}

Assistant:

TEST_IMPL(strtok) {
  struct strtok_test_case tests[] = {
    { "abc", "" },
    { "abc.abf", "." },
    { "This;is.a:test:of=the/string\\tokenizer-function.", "\\/:;=-" },
    { "Hello This-is-a-nice.-string", " ." },
  };
  size_t tokens_len = ARRAY_SIZE(tokens);
  size_t tests_len = ARRAY_SIZE(tests);
  size_t i;
  size_t j;
  char* itr;
  char* tok_r;
  char current_test[2048];

  for (i = 0, j = 0; i < tests_len; i += 1) {
    ASSERT_LT(j, tokens_len);
    snprintf(current_test, sizeof(current_test), "%s", tests[i].str);
    tok_r = uv__strtok(current_test, tests[i].sep, &itr);
    ASSERT_STRCMP(tok_r, tokens[j]);
    j++;
    while (tok_r) {
      ASSERT_LT(j, tokens_len);
      tok_r = uv__strtok(NULL, tests[i].sep, &itr);
      ASSERT_STRCMP(tok_r, tokens[j]);
      j++;
    }
  }
  return 0;
}